

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

StrMap * jsonnet::internal::jsonnet_vm_execute_multi
                   (Allocator *alloc,AST *ast,ExtMap *ext_vars,uint max_stack,double gc_min_objects,
                   double gc_growth_trigger,VmNativeCallbackMap *natives,
                   JsonnetImportCallback *import_callback,void *ctx,bool string_output)

{
  StrMap *in_RDI;
  Interpreter vm;
  JsonnetImportCallback *in_stack_00000b08;
  VmNativeCallbackMap *in_stack_00000b10;
  double in_stack_00000b18;
  double in_stack_00000b20;
  uint in_stack_00000b2c;
  ExtMap *in_stack_00000b30;
  Allocator *in_stack_00000b38;
  Interpreter *in_stack_00000b40;
  void *in_stack_00000b50;
  uint in_stack_00003434;
  AST *in_stack_00003438;
  Interpreter *in_stack_00003440;
  Interpreter *in_stack_fffffffffffffdd0;
  
  anon_unknown_0::Interpreter::Interpreter
            (in_stack_00000b40,in_stack_00000b38,in_stack_00000b30,in_stack_00000b2c,
             in_stack_00000b20,in_stack_00000b18,in_stack_00000b10,in_stack_00000b08,
             in_stack_00000b50);
  anon_unknown_0::Interpreter::evaluate(in_stack_00003440,in_stack_00003438,in_stack_00003434);
  (anonymous_namespace)::Interpreter::manifestMulti_abi_cxx11_
            ((Interpreter *)vm.builtins._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
             vm.builtins._M_t._M_impl.super__Rb_tree_header._M_header._M_left._7_1_);
  anon_unknown_0::Interpreter::~Interpreter(in_stack_fffffffffffffdd0);
  return in_RDI;
}

Assistant:

StrMap jsonnet_vm_execute_multi(Allocator *alloc, const AST *ast, const ExtMap &ext_vars,
                                unsigned max_stack, double gc_min_objects, double gc_growth_trigger,
                                const VmNativeCallbackMap &natives,
                                JsonnetImportCallback *import_callback, void *ctx,
                                bool string_output)
{
    Interpreter vm(alloc,
                   ext_vars,
                   max_stack,
                   gc_min_objects,
                   gc_growth_trigger,
                   natives,
                   import_callback,
                   ctx);
    vm.evaluate(ast, 0);
    return vm.manifestMulti(string_output);
}